

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

uintmax_t fs_space_available(string_view path)

{
  string_view path_00;
  bool bVar1;
  string_view local_90;
  error_category *local_80;
  char *local_78;
  path local_70;
  undefined1 local_48 [8];
  space_info s;
  error_code ec;
  string_view path_local;
  
  ec._M_cat = (error_category *)path._M_len;
  std::error_code::error_code((error_code *)&s.available);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_70,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,auto_format);
  std::filesystem::space((path *)local_48,(error_code *)&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&s.available);
  if (bVar1) {
    local_80 = ec._M_cat;
    local_78 = path._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_90,"fs_space_available");
    path_00._M_str = local_78;
    path_00._M_len = (size_t)local_80;
    fs_print_error(path_00,local_90,(error_code *)&s.available);
    path_local._M_str = (char *)0x0;
  }
  else {
    path_local._M_str = (char *)s.free;
  }
  return (uintmax_t)path_local._M_str;
}

Assistant:

std::uintmax_t fs_space_available(std::string_view path)
{
  // filesystem space available for device holding path

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  if(auto s = std::filesystem::space(path, ec); !ec)  FFS_LIKELY
    return s.available;
#elif defined(_WIN32)
  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getdiskfreespaceexa
  if(ULARGE_INTEGER b;
      GetDiskFreeSpaceExA(path.data(), &b, nullptr, nullptr) != 0)  FFS_LIKELY
    return b.QuadPart;
#elif defined(HAVE_STATVFS)
  // https://www.man7.org/linux/man-pages/man3/statvfs.3.html
  // https://unix.stackexchange.com/a/703650
  struct statvfs stat;
  if (!statvfs(path.data(), &stat))  FFS_LIKELY
    return (stat.f_frsize ? stat.f_frsize : stat.f_bsize) * stat.f_bavail;
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(path, __func__, ec);
  return {};
}